

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::
concat<kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_14UL> *params,
          FixedArray<char,_1UL> *params_1,CappedArray<char,_14UL> *params_2,
          FixedArray<char,_1UL> *params_3,CappedArray<char,_14UL> *params_4)

{
  size_t size;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_58 = *(undefined8 *)this;
  local_50 = 1;
  local_48 = *(undefined8 *)params_1;
  local_40 = 1;
  local_38 = *(undefined8 *)params_3;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x5;
  size = sum((_ *)&local_58,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
            (target,(CappedArray<char,_14UL> *)this,(FixedArray<char,_1UL> *)params,
             (CappedArray<char,_14UL> *)params_1,(FixedArray<char,_1UL> *)params_2,
             (CappedArray<char,_14UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}